

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O0

u8 * __thiscall SM83::Get8bitRegisterPointer<(SM83::Registers)2>(SM83 *this)

{
  SM83 *this_local;
  
  return (u8 *)((long)&this->field_1 + 1);
}

Assistant:

u8* SM83::Get8bitRegisterPointer() {
    static_assert(Register < Registers::AF, "Use Get16bitRegisterPointer for 16bit registers");

    switch (Register) {
        case Registers::A:
            return &a;
        case Registers::F:
            return &f;
        case Registers::B:
            return &b;
        case Registers::C:
            return &c;
        case Registers::D:
            return &d;
        case Registers::E:
            return &e;
        case Registers::H:
            return &h;
        case Registers::L:
            return &l;
        default:
            UNREACHABLE();
    }
}